

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetRPATH(cmGeneratorTarget *this,string *config,string *prop,string *rpath)

{
  char *pcVar1;
  cmGeneratorExpression ge;
  undefined1 local_70 [24];
  cmListFileBacktrace local_58;
  string local_40;
  
  pcVar1 = GetProperty(this,prop);
  if (pcVar1 != (char *)0x0) {
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_70 + 8),&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,local_70 + 8);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_70._0_8_,this->LocalGenerator,config,false,
               (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&local_40);
    std::__cxx11::string::_M_assign((string *)rpath);
    std::__cxx11::string::~string((string *)&local_40);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_70);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_70 + 8));
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool cmGeneratorTarget::GetRPATH(const std::string& config,
                                 const std::string& prop,
                                 std::string& rpath) const
{
  const char* value = this->GetProperty(prop);
  if (!value) {
    return false;
  }

  cmGeneratorExpression ge;
  rpath = ge.Parse(value)->Evaluate(this->LocalGenerator, config);

  return true;
}